

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChildElement(TiXmlHandle *this)

{
  long lVar1;
  TiXmlNode *pTVar2;
  long *in_RSI;
  long *plVar3;
  
  if (*in_RSI != 0) {
    pTVar2 = (TiXmlNode *)0x0;
    for (plVar3 = *(long **)(*in_RSI + 0x28); plVar3 != (long *)0x0; plVar3 = (long *)plVar3[9]) {
      lVar1 = (**(code **)(*plVar3 + 0x28))(plVar3);
      if (lVar1 != 0) {
        pTVar2 = (TiXmlNode *)(**(code **)(*plVar3 + 0x28))(plVar3);
        break;
      }
    }
    if (pTVar2 != (TiXmlNode *)0x0) goto LAB_00172148;
  }
  pTVar2 = (TiXmlNode *)0x0;
LAB_00172148:
  this->node = pTVar2;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChildElement() const {
	if (node) {
		TiXmlElement* child = node->FirstChildElement();
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}